

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *hs,uint16_t *out_group_id)

{
  uint16_t id;
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  iterator puVar3;
  iterator puVar4;
  Span<const_unsigned_short> SVar5;
  uint16_t supp_group;
  iterator __end2;
  iterator __begin2;
  Span<const_unsigned_short> *__range2;
  uint16_t pref_group;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *__range1;
  unsigned_short *local_68;
  unsigned_short *local_60;
  undefined1 local_58 [8];
  Span<const_unsigned_short> supp;
  Span<const_unsigned_short> pref;
  Span<const_unsigned_short> groups;
  SSL *ssl;
  uint16_t *out_group_id_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if ((ssl_00->field_0xa4 & 1) == 0) {
    __assert_fail("ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xd9,"bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *, uint16_t *)");
  }
  SVar5 = tls1_get_grouplist(hs);
  Span<const_unsigned_short>::Span((Span<const_unsigned_short> *)&supp.size_);
  Span<const_unsigned_short>::Span((Span<const_unsigned_short> *)local_58);
  pref.size_ = (size_t)SVar5.data_;
  groups.data_ = (unsigned_short *)SVar5.size_;
  if ((ssl_00->options & 0x400000) == 0) {
    Span<unsigned_short_const>::Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
              ((Span<unsigned_short_const> *)&__range1,&hs->peer_supported_group_list);
    supp.size_ = (size_t)__range1;
    local_58 = (undefined1  [8])pref.size_;
    supp.data_ = groups.data_;
  }
  else {
    supp.size_ = pref.size_;
    Span<unsigned_short_const>::Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
              ((Span<unsigned_short_const> *)&local_68,&hs->peer_supported_group_list);
    local_58 = (undefined1  [8])local_68;
    supp.data_ = local_60;
  }
  __end1 = Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)&supp.size_);
  puVar3 = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)&supp.size_);
  do {
    if (__end1 == puVar3) {
      return false;
    }
    id = *__end1;
    __end2 = Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)local_58);
    puVar4 = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)local_58);
    for (; __end2 != puVar4; __end2 = __end2 + 1) {
      if ((id == *__end2) &&
         ((uVar2 = ssl_protocol_version(ssl_00), 0x303 < uVar2 ||
          (bVar1 = is_post_quantum_group(id), !bVar1)))) {
        *out_group_id = id;
        return true;
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool tls1_get_shared_group(SSL_HANDSHAKE *hs, uint16_t *out_group_id) {
  SSL *const ssl = hs->ssl;
  assert(ssl->server);

  // Clients are not required to send a supported_groups extension. In this
  // case, the server is free to pick any group it likes. See RFC 4492,
  // section 4, paragraph 3.
  //
  // However, in the interests of compatibility, we will skip ECDH if the
  // client didn't send an extension because we can't be sure that they'll
  // support our favoured group. Thus we do not special-case an emtpy
  // |peer_supported_group_list|.

  Span<const uint16_t> groups = tls1_get_grouplist(hs);
  Span<const uint16_t> pref, supp;
  if (ssl->options & SSL_OP_CIPHER_SERVER_PREFERENCE) {
    pref = groups;
    supp = hs->peer_supported_group_list;
  } else {
    pref = hs->peer_supported_group_list;
    supp = groups;
  }

  for (uint16_t pref_group : pref) {
    for (uint16_t supp_group : supp) {
      if (pref_group == supp_group &&
          // Post-quantum key agreements don't fit in the u8-length-prefixed
          // ECPoint field in TLS 1.2 and below.
          (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
           !is_post_quantum_group(pref_group))) {
        *out_group_id = pref_group;
        return true;
      }
    }
  }

  return false;
}